

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmFunctionCall(LlvmCompilationContext *ctx,ExprFunctionCall *node)

{
  LLVMBuilderRef pLVar1;
  LLVMContextRef pLVar2;
  uint uVar3;
  TypeFunction *functionType_00;
  LLVMTypeRef pLVar4;
  LLVMValueRef pLVar5;
  LLVMAttributeRef pLVar6;
  LLVMValueRef local_198;
  LLVMValueRef result;
  LLVMTypeRef functionType;
  LLVMValueRef functionRef;
  LLVMValueRef local_178;
  ExprBase *local_170;
  ExprBase *value;
  TypeHandle *argumentType;
  LLVMValueRefOpaque *local_150;
  LLVMValueRef resultStorage;
  undefined1 auStack_140 [7];
  bool isStructReturnType;
  SmallArray<LLVMValueRefOpaque_*,_32U> arguments;
  LLVMValueRef function;
  TypeFunction *typeFunction;
  ExprFunctionCall *node_local;
  LlvmCompilationContext *ctx_local;
  
  functionType_00 = getType<TypeFunction>(node->function->type);
  arguments.allocator = (Allocator *)CompileLlvm(ctx,node->function);
  SmallArray<LLVMValueRefOpaque_*,_32U>::SmallArray
            ((SmallArray<LLVMValueRefOpaque_*,_32U> *)auStack_140,ctx->allocator);
  resultStorage._7_1_ = IsStructReturnType(functionType_00->returnType);
  local_150 = (LLVMValueRef)0x0;
  if ((bool)resultStorage._7_1_) {
    pLVar1 = ctx->builder;
    pLVar4 = CompileLlvmType(ctx,functionType_00->returnType);
    local_150 = LLVMBuildAlloca(pLVar1,pLVar4,"call_return_storage");
    SmallArray<LLVMValueRefOpaque_*,_32U>::push_back
              ((SmallArray<LLVMValueRefOpaque_*,_32U> *)auStack_140,&local_150);
  }
  value = (ExprBase *)(functionType_00->arguments).head;
  for (local_170 = (node->arguments).head; local_170 != (ExprBase *)0x0; local_170 = local_170->next
      ) {
    local_178 = CompileArgument(ctx,(TypeBase *)value->_vptr_ExprBase,local_170);
    SmallArray<LLVMValueRefOpaque_*,_32U>::push_back
              ((SmallArray<LLVMValueRefOpaque_*,_32U> *)auStack_140,&local_178);
    value = *(ExprBase **)&value->typeID;
  }
  functionRef = LLVMBuildExtractValue(ctx->builder,(LLVMValueRef)arguments.allocator,0,"context");
  SmallArray<LLVMValueRefOpaque_*,_32U>::push_back
            ((SmallArray<LLVMValueRefOpaque_*,_32U> *)auStack_140,&functionRef);
  pLVar5 = LLVMBuildExtractValue(ctx->builder,(LLVMValueRef)arguments.allocator,1,"function");
  pLVar4 = CompileLlvmFunctionType(ctx,functionType_00);
  pLVar4 = LLVMPointerType(pLVar4,0);
  pLVar5 = LLVMBuildPointerCast(ctx->builder,pLVar5,pLVar4,"to_func_type");
  local_198 = LLVMBuildCall(ctx->builder,pLVar5,_auStack_140,(uint)arguments.data,"");
  if ((resultStorage._7_1_ & 1) != 0) {
    pLVar2 = ctx->context;
    uVar3 = LLVMGetEnumAttributeKindForName("sret",4);
    pLVar6 = LLVMCreateEnumAttribute(pLVar2,uVar3,0);
    LLVMAddCallSiteAttribute(local_198,1,pLVar6);
    local_198 = LLVMBuildLoad(ctx->builder,local_150,"");
  }
  pLVar5 = ConvertToStackType(ctx,local_198,(node->super_ExprBase).type);
  pLVar5 = CheckType(ctx,&node->super_ExprBase,pLVar5);
  SmallArray<LLVMValueRefOpaque_*,_32U>::~SmallArray
            ((SmallArray<LLVMValueRefOpaque_*,_32U> *)auStack_140);
  return pLVar5;
}

Assistant:

LLVMValueRef CompileLlvmFunctionCall(LlvmCompilationContext &ctx, ExprFunctionCall *node)
{
	TypeFunction *typeFunction = getType<TypeFunction>(node->function->type);

	LLVMValueRef function = CompileLlvm(ctx, node->function);

	SmallArray<LLVMValueRef, 32> arguments(ctx.allocator);

	bool isStructReturnType = IsStructReturnType(typeFunction->returnType);
	LLVMValueRef resultStorage = NULL;

	if(isStructReturnType)
	{
		resultStorage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, typeFunction->returnType), "call_return_storage");

		arguments.push_back(resultStorage);
	}

	TypeHandle *argumentType = typeFunction->arguments.head;

	for(ExprBase *value = node->arguments.head; value; value = value->next)
	{
		arguments.push_back(CompileArgument(ctx, argumentType->type, value));

		argumentType = argumentType->next;
	}

	arguments.push_back(LLVMBuildExtractValue(ctx.builder, function, 0, "context"));

	LLVMValueRef functionRef = LLVMBuildExtractValue(ctx.builder, function, 1, "function");

	LLVMTypeRef functionType = LLVMPointerType(CompileLlvmFunctionType(ctx, typeFunction), 0);

	functionRef = LLVMBuildPointerCast(ctx.builder, functionRef, functionType, "to_func_type");

	LLVMValueRef result = LLVMBuildCall(ctx.builder, functionRef, arguments.data, arguments.count, "");

	if(isStructReturnType)
	{
		LLVMAddCallSiteAttribute(result, 1, LLVMCreateEnumAttribute(ctx.context, LLVMGetEnumAttributeKindForName("sret", unsigned(strlen("sret"))), 0));

		result = LLVMBuildLoad(ctx.builder, resultStorage, "");
	}

	return CheckType(ctx, node, ConvertToStackType(ctx, result, node->type));
}